

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.h
# Opt level: O3

bool mocker::detail::runOptPassImpl<mocker::InductionVariable,mocker::FuncAttr&>
               (Module *module,FuncPass *param_2,FuncAttr *args)

{
  bool bVar1;
  bool bVar2;
  _Hash_node_base *p_Var3;
  InductionVariable local_1d8;
  
  p_Var3 = (module->funcs)._M_h._M_before_begin._M_nxt;
  if (p_Var3 == (_Hash_node_base *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    do {
      if (*(char *)&p_Var3[0x11]._M_nxt == '\0') {
        local_1d8.super_FuncPass.func = (FunctionModule *)(p_Var3 + 5);
        local_1d8.super_FuncPass.super_OptPass._vptr_OptPass =
             (_func_int **)&PTR__InductionVariable_001eb418;
        local_1d8.loopInfo.loops._M_h._M_buckets = &local_1d8.loopInfo.loops._M_h._M_single_bucket;
        local_1d8.loopInfo.loops._M_h._M_bucket_count = 1;
        local_1d8.loopInfo.loops._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_1d8.loopInfo.loops._M_h._M_element_count = 0;
        local_1d8.loopInfo.loops._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_1d8.loopInfo.loops._M_h._M_rehash_policy._M_next_resize = 0;
        local_1d8.loopInfo.loops._M_h._M_single_bucket = (__node_base_ptr)0x0;
        local_1d8.loopInfo.loopTree._M_h._M_buckets =
             &local_1d8.loopInfo.loopTree._M_h._M_single_bucket;
        local_1d8.loopInfo.loopTree._M_h._M_bucket_count = 1;
        local_1d8.loopInfo.loopTree._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_1d8.loopInfo.loopTree._M_h._M_element_count = 0;
        local_1d8.loopInfo.loopTree._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_1d8.loopInfo.loopTree._M_h._M_rehash_policy._M_next_resize = 0;
        local_1d8.loopInfo.loopTree._M_h._M_single_bucket = (__node_base_ptr)0x0;
        local_1d8.loopInfo.root = 0xffffffffffffffff;
        local_1d8.loopInfo.depth._M_h._M_buckets = &local_1d8.loopInfo.depth._M_h._M_single_bucket;
        local_1d8.loopInfo.depth._M_h._M_bucket_count = 1;
        local_1d8.loopInfo.depth._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_1d8.loopInfo.depth._M_h._M_element_count = 0;
        local_1d8.loopInfo.depth._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_1d8.loopInfo.depth._M_h._M_rehash_policy._M_next_resize = 0;
        local_1d8.loopInfo.depth._M_h._M_single_bucket = (__node_base_ptr)0x0;
        local_1d8.loopInfo.loopInvariant._M_h._M_buckets =
             &local_1d8.loopInfo.loopInvariant._M_h._M_single_bucket;
        local_1d8.loopInfo.loopInvariant._M_h._M_bucket_count = 1;
        local_1d8.loopInfo.loopInvariant._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_1d8.loopInfo.loopInvariant._M_h._M_element_count = 0;
        local_1d8.loopInfo.loopInvariant._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_1d8.loopInfo.loopInvariant._M_h._M_rehash_policy._M_next_resize = 0;
        local_1d8.loopInfo.loopInvariant._M_h._M_single_bucket = (__node_base_ptr)0x0;
        local_1d8.useDef.chain._M_h._M_buckets = &local_1d8.useDef.chain._M_h._M_single_bucket;
        local_1d8.useDef.chain._M_h._M_bucket_count = 1;
        local_1d8.useDef.chain._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_1d8.useDef.chain._M_h._M_element_count = 0;
        local_1d8.useDef.chain._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_1d8.useDef.chain._M_h._M_rehash_policy._M_next_resize = 0;
        local_1d8.useDef.chain._M_h._M_single_bucket = (__node_base_ptr)0x0;
        local_1d8.defUse.chain._M_h._M_buckets = &local_1d8.defUse.chain._M_h._M_single_bucket;
        local_1d8.defUse.chain._M_h._M_bucket_count = 1;
        local_1d8.defUse.chain._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_1d8.defUse.chain._M_h._M_element_count = 0;
        local_1d8.defUse.chain._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_1d8.defUse.chain._M_h._M_rehash_policy._M_next_resize = 0;
        local_1d8.defUse.chain._M_h._M_single_bucket = (__node_base_ptr)0x0;
        local_1d8.inductionVars._M_h._M_buckets = &local_1d8.inductionVars._M_h._M_single_bucket;
        local_1d8.inductionVars._M_h._M_bucket_count = 1;
        local_1d8.inductionVars._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_1d8.inductionVars._M_h._M_element_count = 0;
        local_1d8.inductionVars._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_1d8.inductionVars._M_h._M_rehash_policy._M_next_resize = 0;
        local_1d8.inductionVars._M_h._M_single_bucket = (__node_base_ptr)0x0;
        local_1d8.funcAttr = args;
        bVar1 = InductionVariable::operator()(&local_1d8);
        bVar2 = (bool)(bVar2 | bVar1);
        local_1d8.super_FuncPass.super_OptPass._vptr_OptPass =
             (_func_int **)&PTR__InductionVariable_001eb418;
        std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_1d8.inductionVars._M_h);
        std::
        _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&local_1d8.defUse);
        std::
        _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&local_1d8.useDef);
        std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_1d8.loopInfo.loopInvariant._M_h);
        std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_1d8.loopInfo.depth._M_h);
        std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_1d8.loopInfo.loopTree._M_h);
        std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&local_1d8.loopInfo);
      }
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  return bVar2;
}

Assistant:

bool runOptPassImpl(ir::Module &module, FuncPass *, Args &&... args) {
  auto res = false;
  for (auto &func : module.getFuncs()) {
    if (func.second.isExternalFunc())
      continue;
    res |= Pass{func.second, std::forward<Args>(args)...}();
  }
  return res;
}